

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

void __thiscall
spectest::CommandRunner::PopulateExports(CommandRunner *this,Ptr *instance,ExportMap *map)

{
  ExportType *pEVar1;
  Instance *pIVar2;
  Module *pMVar3;
  vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_> *pvVar4;
  ExportType *pEVar5;
  RefVec *this_00;
  const_reference pvVar6;
  mapped_type *this_01;
  RefPtr<wabt::interp::Extern> local_68;
  const_reference local_50;
  ExportType *export_type;
  size_t i;
  undefined1 local_38 [8];
  Ptr module;
  ExportMap *map_local;
  Ptr *instance_local;
  CommandRunner *this_local;
  
  module.root_index_ = (Index)map;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
  ::clear(map);
  pIVar2 = wabt::interp::RefPtr<wabt::interp::Instance>::operator->(instance);
  i = (size_t)wabt::interp::Instance::module(pIVar2);
  wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
            ((RefPtr<wabt::interp::Module> *)local_38,&this->store_,(Ref)i);
  export_type = (ExportType *)0x0;
  while( true ) {
    pEVar1 = export_type;
    pMVar3 = wabt::interp::RefPtr<wabt::interp::Module>::operator->
                       ((RefPtr<wabt::interp::Module> *)local_38);
    pvVar4 = wabt::interp::Module::export_types(pMVar3);
    pEVar5 = (ExportType *)
             std::vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>::size
                       (pvVar4);
    if (pEVar5 <= pEVar1) break;
    pMVar3 = wabt::interp::RefPtr<wabt::interp::Module>::operator->
                       ((RefPtr<wabt::interp::Module> *)local_38);
    pvVar4 = wabt::interp::Module::export_types(pMVar3);
    local_50 = std::vector<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>::
               operator[](pvVar4,(size_type)export_type);
    pIVar2 = wabt::interp::RefPtr<wabt::interp::Instance>::operator->(instance);
    this_00 = wabt::interp::Instance::exports(pIVar2);
    pvVar6 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (this_00,(size_type)export_type);
    wabt::interp::Store::UnsafeGet<wabt::interp::Extern>(&local_68,&this->store_,(Ref)pvVar6->index)
    ;
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
                            *)module.root_index_,&local_50->name);
    wabt::interp::RefPtr<wabt::interp::Extern>::operator=(this_01,&local_68);
    wabt::interp::RefPtr<wabt::interp::Extern>::~RefPtr(&local_68);
    export_type = (ExportType *)&(export_type->name).field_0x1;
  }
  wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_38);
  return;
}

Assistant:

void CommandRunner::PopulateExports(const Instance::Ptr& instance,
                                    ExportMap* map) {
  map->clear();
  interp::Module::Ptr module{store_, instance->module()};
  for (size_t i = 0; i < module->export_types().size(); ++i) {
    const ExportType& export_type = module->export_types()[i];
    (*map)[export_type.name] = store_.UnsafeGet<Extern>(instance->exports()[i]);
  }
}